

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FastInt64ToBuffer(int64 i,char *buffer)

{
  char *pcVar1;
  char *local_28;
  char *p;
  char *buffer_local;
  int64 i_local;
  
  pcVar1 = buffer + 0x14;
  buffer[0x15] = '\0';
  buffer_local = (char *)i;
  if (i < 0) {
    if (i < -9) {
      *pcVar1 = (char)(-(i + 10) % 10) + '0';
      buffer_local = (char *)(-(i + 10) / 10 + 1);
      local_28 = buffer + 0x13;
      do {
        i_local = (int64)(local_28 + -1);
        *local_28 = (char)((long)buffer_local % 10) + '0';
        buffer_local = (char *)((long)buffer_local / 10);
        local_28 = (char *)i_local;
      } while (0 < (long)buffer_local);
      *(char *)i_local = '-';
    }
    else {
      i_local = (int64)(buffer + 0x13);
      *pcVar1 = '0' - (char)i;
      *(char *)i_local = '-';
    }
  }
  else {
    do {
      local_28 = pcVar1;
      *local_28 = (char)((long)buffer_local % 10) + '0';
      buffer_local = (char *)((long)buffer_local / 10);
      pcVar1 = local_28 + -1;
    } while (0 < (long)buffer_local);
    i_local = (int64)local_28;
  }
  return (char *)i_local;
}

Assistant:

char *FastInt64ToBuffer(int64 i, char* buffer) {
  // We could collapse the positive and negative sections, but that
  // would be slightly slower for positive numbers...
  // 22 bytes is enough to store -2**64, -18446744073709551616.
  char* p = buffer + kFastInt64ToBufferOffset;
  *p-- = '\0';
  if (i >= 0) {
    do {
      *p-- = '0' + i % 10;
      i /= 10;
    } while (i > 0);
    return p + 1;
  } else {
    // On different platforms, % and / have different behaviors for
    // negative numbers, so we need to jump through hoops to make sure
    // we don't divide negative numbers.
    if (i > -10) {
      i = -i;
      *p-- = '0' + i;
      *p = '-';
      return p;
    } else {
      // Make sure we aren't at MIN_INT, in which case we can't say i = -i
      i = i + 10;
      i = -i;
      *p-- = '0' + i % 10;
      // Undo what we did a moment ago
      i = i / 10 + 1;
      do {
        *p-- = '0' + i % 10;
        i /= 10;
      } while (i > 0);
      *p = '-';
      return p;
    }
  }
}